

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::MergePsbtInputItem
               (wally_psbt_input *psbt,wally_psbt_input *psbt_dest,bool ignore_duplicate_error,
               string *item_name)

{
  size_t sVar1;
  uint8_t *puVar2;
  size_t sVar3;
  string *item_name_00;
  bool bVar4;
  CfdException *pCVar5;
  uint8_t *puVar6;
  wally_map *pwVar7;
  wally_map *pwVar8;
  bool local_339;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  undefined1 local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  CfdSourceLocation local_1a8;
  allocator local_189;
  undefined1 local_188 [8];
  string field_name;
  string local_160;
  CfdSourceLocation local_140;
  byte local_123;
  byte local_122;
  allocator local_121;
  string local_120;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8;
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8;
  CfdSourceLocation local_98;
  undefined1 local_7d;
  allocator local_69;
  string local_68;
  CfdSourceLocation local_48;
  int local_2c;
  string *psStack_28;
  int ret;
  string *item_name_local;
  wally_psbt_input *pwStack_18;
  bool ignore_duplicate_error_local;
  wally_psbt_input *psbt_dest_local;
  wally_psbt_input *psbt_local;
  
  psStack_28 = item_name;
  item_name_local._7_1_ = ignore_duplicate_error;
  pwStack_18 = psbt_dest;
  psbt_dest_local = psbt;
  if (psbt_dest->utxo != (wally_tx *)0x0) {
    if (psbt->utxo == (wally_tx *)0x0) {
      local_2c = wally_psbt_input_set_utxo(psbt,psbt_dest->utxo);
      if (local_2c != 0) {
        local_48.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_48.filename = local_48.filename + 1;
        local_48.line = 0x1ca;
        local_48.funcname = "MergePsbtInputItem";
        logger::warn<int&>(&local_48,"wally_psbt_input_set_utxo NG[{}]",&local_2c);
        local_7d = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_68,"psbt set utxo error.",&local_69);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_68);
        local_7d = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_2c = 0;
    }
    else {
      bVar4 = MatchWallyTx(psbt->utxo,psbt_dest->utxo);
      if ((!bVar4) && ((item_name_local._7_1_ & 1) == 0)) {
        local_98.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_98.filename = local_98.filename + 1;
        local_98.line = 0x1d2;
        local_98.funcname = "MergePsbtInputItem";
        logger::warn<>(&local_98,"psbt txin utxo already exist.");
        local_ba = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_b8,"psbt txin utxo duplicated error.",&local_b9);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_b8);
        local_ba = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  item_name_00 = psStack_28;
  if (pwStack_18->witness_utxo != (wally_tx_output *)0x0) {
    if (psbt_dest_local->witness_utxo == (wally_tx_output *)0x0) {
      local_2c = wally_psbt_input_set_witness_utxo(psbt_dest_local,pwStack_18->witness_utxo);
      if (local_2c != 0) {
        local_d8.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_d8.filename = local_d8.filename + 1;
        local_d8.line = 0x1db;
        local_d8.funcname = "MergePsbtInputItem";
        logger::warn<int&>(&local_d8,"wally_psbt_input_set_witness_utxo NG[{}]",&local_2c);
        local_fa = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_f8,"psbt set witness utxo error.",&local_f9)
        ;
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_f8);
        local_fa = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_2c = 0;
    }
    else {
      local_122 = 0;
      local_123 = 0;
      local_339 = false;
      if (psbt_dest_local->witness_utxo->satoshi == pwStack_18->witness_utxo->satoshi) {
        puVar6 = psbt_dest_local->witness_utxo->script;
        sVar1 = psbt_dest_local->witness_utxo->script_len;
        puVar2 = pwStack_18->witness_utxo->script;
        sVar3 = pwStack_18->witness_utxo->script_len;
        ::std::allocator<char>::allocator();
        local_122 = 1;
        ::std::__cxx11::string::string((string *)&local_120,"scriptPubkey",&local_121);
        local_123 = 1;
        local_339 = ComparePsbtData(puVar6,sVar1,puVar2,sVar3,item_name_00,&local_120,
                                    (bool)(item_name_local._7_1_ & 1));
      }
      if ((local_123 & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_120);
      }
      if ((local_122 & 1) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
      if ((local_339 == false) && ((item_name_local._7_1_ & 1) == 0)) {
        local_140.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_140.filename = local_140.filename + 1;
        local_140.line = 0x1ea;
        local_140.funcname = "MergePsbtInputItem";
        logger::warn<>(&local_140,"psbt txin witness utxo already exist.");
        field_name.field_2._M_local_buf[0xe] = '\x01';
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_160,"psbt txin witness utxo duplicated error.",
                   (allocator *)(field_name.field_2._M_local_buf + 0xf));
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_160);
        field_name.field_2._M_local_buf[0xe] = '\0';
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  if (pwStack_18->sighash != 0) {
    if (psbt_dest_local->sighash == 0) {
      psbt_dest_local->sighash = pwStack_18->sighash;
    }
    else if ((psbt_dest_local->sighash != pwStack_18->sighash) && ((item_name_local._7_1_ & 1) == 0)
            ) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_188,"txin sighashtype",&local_189);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_189);
      local_1a8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_1a8.filename = local_1a8.filename + 1;
      local_1a8.line = 0x1f9;
      local_1a8.funcname = "MergePsbtInputItem";
      logger::warn<std::__cxx11::string&>
                (&local_1a8,"psbt {} already exist.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      local_1e9 = 1;
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+(&local_1e8,"psbt ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188);
      ::std::operator+(&local_1c8,&local_1e8," duplicated error.");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_1c8);
      local_1e9 = 0;
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  if (pwStack_18->redeem_script_len != 0) {
    if (psbt_dest_local->redeem_script_len == 0) {
      puVar6 = AllocWallyBuffer(pwStack_18->redeem_script,pwStack_18->redeem_script_len);
      psbt_dest_local->redeem_script = puVar6;
      psbt_dest_local->redeem_script_len = pwStack_18->redeem_script_len;
    }
    else {
      puVar6 = psbt_dest_local->redeem_script;
      sVar1 = psbt_dest_local->redeem_script_len;
      puVar2 = pwStack_18->redeem_script;
      sVar3 = pwStack_18->redeem_script_len;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_210,"txin redeem script",&local_211);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_238,"",&local_239);
      ComparePsbtData(puVar6,sVar1,puVar2,sVar3,&local_210,&local_238,
                      (bool)(item_name_local._7_1_ & 1));
      ::std::__cxx11::string::~string((string *)&local_238);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_239);
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
  }
  if (pwStack_18->witness_script_len != 0) {
    if (psbt_dest_local->witness_script_len == 0) {
      puVar6 = AllocWallyBuffer(pwStack_18->witness_script,pwStack_18->witness_script_len);
      psbt_dest_local->witness_script = puVar6;
      psbt_dest_local->witness_script_len = pwStack_18->witness_script_len;
    }
    else {
      puVar6 = psbt_dest_local->witness_script;
      sVar1 = psbt_dest_local->witness_script_len;
      puVar2 = pwStack_18->witness_script;
      sVar3 = pwStack_18->witness_script_len;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_260,"txin witness script",&local_261);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_288,"",&local_289);
      ComparePsbtData(puVar6,sVar1,puVar2,sVar3,&local_260,&local_288,
                      (bool)(item_name_local._7_1_ & 1));
      ::std::__cxx11::string::~string((string *)&local_288);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_289);
      ::std::__cxx11::string::~string((string *)&local_260);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_261);
    }
  }
  pwVar7 = &psbt_dest_local->keypaths;
  pwVar8 = &pwStack_18->keypaths;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2b0,"txin keypaths",&local_2b1);
  MergeWallyMap(pwVar7,pwVar8,&local_2b0,(bool)(item_name_local._7_1_ & 1));
  ::std::__cxx11::string::~string((string *)&local_2b0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  pwVar7 = &psbt_dest_local->signatures;
  pwVar8 = &pwStack_18->signatures;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2d8,"txin signatures",&local_2d9);
  MergeWallyMap(pwVar7,pwVar8,&local_2d8,(bool)(item_name_local._7_1_ & 1));
  ::std::__cxx11::string::~string((string *)&local_2d8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  pwVar7 = &psbt_dest_local->unknowns;
  pwVar8 = &pwStack_18->unknowns;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_300,"txin unknowns",&local_301);
  MergeWallyMap(pwVar7,pwVar8,&local_300,(bool)(item_name_local._7_1_ & 1));
  ::std::__cxx11::string::~string((string *)&local_300);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_301);
  return;
}

Assistant:

void MergePsbtInputItem(
    struct wally_psbt_input *psbt, const struct wally_psbt_input *psbt_dest,
    bool ignore_duplicate_error, const std::string &item_name) {
  int ret;
  if (psbt_dest->utxo != nullptr) {
    if (psbt->utxo == nullptr) {
      ret = wally_psbt_input_set_utxo(psbt, psbt_dest->utxo);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_psbt_input_set_utxo NG[{}]", ret);
        throw CfdException(kCfdIllegalArgumentError, "psbt set utxo error.");
      }
    } else if (MatchWallyTx(psbt->utxo, psbt_dest->utxo)) {
      // match
    } else if (ignore_duplicate_error) {
      // do nothing
    } else {
      warn(CFD_LOG_SOURCE, "psbt txin utxo already exist.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt txin utxo duplicated error.");
    }
  }
  if (psbt_dest->witness_utxo != nullptr) {
    if (psbt->witness_utxo == nullptr) {
      ret = wally_psbt_input_set_witness_utxo(psbt, psbt_dest->witness_utxo);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt set witness utxo error.");
      }
    } else if (
        (psbt->witness_utxo->satoshi == psbt_dest->witness_utxo->satoshi) &&
        ComparePsbtData(
            psbt->witness_utxo->script, psbt->witness_utxo->script_len,
            psbt_dest->witness_utxo->script,
            psbt_dest->witness_utxo->script_len, item_name, "scriptPubkey",
            ignore_duplicate_error)) {
      // match
    } else if (ignore_duplicate_error) {
      // do nothing
    } else {
      warn(CFD_LOG_SOURCE, "psbt txin witness utxo already exist.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt txin witness utxo duplicated error.");
    }
  }
  if (psbt_dest->sighash > 0) {
    if (psbt->sighash == 0) {
      psbt->sighash = psbt_dest->sighash;
    } else if (psbt->sighash == psbt_dest->sighash) {
      // match
    } else if (ignore_duplicate_error) {
      // do nothing
    } else {
      std::string field_name = "txin sighashtype";
      warn(CFD_LOG_SOURCE, "psbt {} already exist.", field_name);
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt " + field_name + " duplicated error.");
    }
  }
  if (psbt_dest->redeem_script_len > 0) {
    if (psbt->redeem_script_len == 0) {
      psbt->redeem_script = AllocWallyBuffer(
          psbt_dest->redeem_script, psbt_dest->redeem_script_len);
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    } else {
      ComparePsbtData(
          psbt->redeem_script, psbt->redeem_script_len,
          psbt_dest->redeem_script, psbt_dest->redeem_script_len,
          "txin redeem script", "", ignore_duplicate_error);
    }
  }
  if (psbt_dest->witness_script_len > 0) {
    if (psbt->witness_script_len == 0) {
      psbt->witness_script = AllocWallyBuffer(
          psbt_dest->witness_script, psbt_dest->witness_script_len);
      psbt->witness_script_len = psbt_dest->witness_script_len;
    } else {
      ComparePsbtData(
          psbt->witness_script, psbt->witness_script_len,
          psbt_dest->witness_script, psbt_dest->witness_script_len,
          "txin witness script", "", ignore_duplicate_error);
    }
  }
  MergeWallyMap(
      &psbt->keypaths, &psbt_dest->keypaths, "txin keypaths",
      ignore_duplicate_error);
  MergeWallyMap(
      &psbt->signatures, &psbt_dest->signatures, "txin signatures",
      ignore_duplicate_error);
  MergeWallyMap(
      &psbt->unknowns, &psbt_dest->unknowns, "txin unknowns",
      ignore_duplicate_error);
}